

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QFontDatabase::WritingSystem>::begin(QList<QFontDatabase::WritingSystem> *this)

{
  WritingSystem *n;
  QArrayDataPointer<QFontDatabase::WritingSystem> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QFontDatabase::WritingSystem> *)0x59d0a9);
  QArrayDataPointer<QFontDatabase::WritingSystem>::operator->(in_RDI);
  n = QArrayDataPointer<QFontDatabase::WritingSystem>::begin
                ((QArrayDataPointer<QFontDatabase::WritingSystem> *)0x59d0ba);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }